

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

Var Js::JavascriptFunction::ConstructHelper
              (RecyclableObject *function,Var thisArg,Var overridingNewTarget,Var argArray,
              ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  Var pvVar3;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  pvVar3 = CalloutHelper<true>(function,thisArg,overridingNewTarget,argArray,scriptContext);
  pTVar2->reentrancySafeOrHandled = bVar1;
  return pvVar3;
}

Assistant:

Var JavascriptFunction::ConstructHelper(RecyclableObject* function, Var thisArg, Var overridingNewTarget, Var argArray, ScriptContext* scriptContext)
    {
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CalloutHelper<true>(function, thisArg, overridingNewTarget, argArray, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
    }